

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  int iVar1;
  int iVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  REF_CAVITY pRVar7;
  REF_CAVITY pRVar8;
  REF_STATUS RVar9;
  uint uVar10;
  REF_CELL pRVar11;
  REF_INT RVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  int local_88;
  int local_80;
  int local_7c;
  int local_78;
  REF_INT local_74;
  REF_CAVITY local_70;
  REF_NODE local_68;
  ulong local_60;
  long local_58;
  REF_INT local_4c [3];
  long local_40;
  REF_CELL local_38;
  
  local_68 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node0;
  iVar1 = local_68->ref_mpi->id;
  local_40 = (long)node0;
  if ((iVar1 == local_68->part[local_40]) &&
     (local_58 = (long)node1, iVar1 == local_68->part[local_58])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cavity->collapse_node0 = node0;
      ref_cavity->collapse_node1 = node1;
      pRVar11 = ref_grid->cell[8];
      uVar18 = 0xffffffff;
      if (-1 < node0) {
        uVar18 = 0xffffffff;
        if (node0 < pRVar11->ref_adj->nnode) {
          uVar18 = (ulong)(uint)pRVar11->ref_adj->first[local_40];
        }
      }
      local_70 = ref_cavity;
      if ((int)uVar18 != -1) {
        RVar12 = pRVar11->ref_adj->item[(int)uVar18].ref;
        do {
          ref_cavity = local_70;
          local_60 = CONCAT44(local_60._4_4_,RVar12);
          RVar9 = ref_list_contains(local_70->tet_list,RVar12,&local_80);
          if (RVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x5fb,"ref_cavity_form_edge_collapse");
            return RVar9;
          }
          if (local_80 == 0) {
            RVar9 = ref_list_push(ref_cavity->tet_list,(REF_INT)local_60);
            if (RVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x5fd,"ref_cavity_form_edge_collapse");
              return RVar9;
            }
            if (0 < (long)pRVar11->node_per) {
              lVar15 = 0;
              bVar17 = false;
              bVar16 = false;
              do {
                bVar21 = true;
                bVar20 = true;
                if (!bVar16) {
                  bVar20 = pRVar11->c2n[(long)pRVar11->size_per * (long)(REF_INT)local_60 + lVar15]
                           == node0;
                }
                if (!bVar17) {
                  bVar21 = pRVar11->c2n[(long)pRVar11->size_per * (long)(REF_INT)local_60 + lVar15]
                           == node1;
                }
                if (local_68->ref_mpi->id !=
                    local_68->part[pRVar11->c2n[pRVar11->size_per * (REF_INT)local_60 + lVar15]])
                goto LAB_001365ab;
                lVar15 = lVar15 + 1;
                bVar17 = bVar21;
                bVar16 = bVar20;
              } while (pRVar11->node_per != lVar15);
              if ((bool)(bVar20 & bVar21)) goto LAB_001358f0;
            }
            if (0 < pRVar11->face_per) {
              lVar19 = (long)(REF_INT)local_60;
              lVar14 = 0;
              lVar15 = 0;
              local_38 = pRVar11;
              do {
                pRVar4 = pRVar11->c2n;
                iVar1 = pRVar11->size_per;
                pRVar5 = pRVar11->f2n;
                lVar13 = 0;
                bVar17 = false;
                do {
                  bVar16 = bVar17;
                  iVar2 = pRVar4[(long)*(int *)((long)pRVar5 + lVar13 * 4 + lVar14) + iVar1 * lVar19
                                ];
                  local_4c[lVar13] = iVar2;
                  lVar13 = lVar13 + 1;
                  bVar17 = (bool)(bVar16 | iVar2 == node0);
                } while (lVar13 != 3);
                if ((!bVar16 && iVar2 != node0) &&
                   (uVar10 = ref_cavity_insert_face(local_70,local_4c), pRVar11 = local_38,
                   uVar10 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x611,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tet face");
                  return uVar10;
                }
                lVar15 = lVar15 + 1;
                lVar14 = lVar14 + 0x10;
              } while (lVar15 < pRVar11->face_per);
            }
          }
LAB_001358f0:
          pRVar3 = pRVar11->ref_adj->item;
          local_88 = (int)uVar18;
          iVar1 = pRVar3[local_88].next;
          uVar18 = (ulong)iVar1;
          if (uVar18 == 0xffffffffffffffff) {
            RVar12 = -1;
          }
          else {
            RVar12 = pRVar3[uVar18].ref;
          }
        } while (iVar1 != -1);
      }
      RVar12 = -1;
      uVar18 = 0xffffffff;
      if (-1 < node1) {
        uVar18 = 0xffffffff;
        if (node1 < pRVar11->ref_adj->nnode) {
          uVar18 = (ulong)(uint)pRVar11->ref_adj->first[local_58];
        }
      }
      if ((int)uVar18 != -1) {
        RVar12 = pRVar11->ref_adj->item[(int)uVar18].ref;
      }
      while (ref_cavity = local_70, (int)uVar18 != -1) {
        local_60 = uVar18;
        RVar9 = ref_list_contains(local_70->tet_list,RVar12,&local_80);
        if (RVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x618,"ref_cavity_form_edge_collapse");
          return RVar9;
        }
        if (local_80 == 0) {
          RVar9 = ref_list_push(ref_cavity->tet_list,RVar12);
          if (RVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x61a,"ref_cavity_form_edge_collapse");
            return RVar9;
          }
          if (0 < (long)pRVar11->node_per) {
            lVar15 = 0;
            bVar17 = false;
            bVar16 = false;
            do {
              bVar21 = true;
              bVar20 = true;
              if (!bVar16) {
                bVar20 = pRVar11->c2n[(long)pRVar11->size_per * (long)RVar12 + lVar15] == node0;
              }
              if (!bVar17) {
                bVar21 = pRVar11->c2n[(long)pRVar11->size_per * (long)RVar12 + lVar15] == node1;
              }
              if (local_68->ref_mpi->id !=
                  local_68->part[pRVar11->c2n[pRVar11->size_per * RVar12 + lVar15]])
              goto LAB_001365ab;
              lVar15 = lVar15 + 1;
              bVar17 = bVar21;
              bVar16 = bVar20;
            } while (pRVar11->node_per != lVar15);
            if ((bool)(bVar20 & bVar21)) goto LAB_00135baf;
          }
          if (0 < pRVar11->face_per) {
            lVar19 = 0;
            lVar15 = 0;
            do {
              pRVar4 = pRVar11->c2n;
              iVar1 = pRVar11->size_per;
              pRVar5 = pRVar11->f2n;
              lVar14 = 0;
              bVar17 = false;
              do {
                bVar16 = bVar17;
                iVar2 = pRVar4[(long)*(int *)((long)pRVar5 + lVar14 * 4 + lVar19) +
                               (long)iVar1 * (long)RVar12];
                local_4c[lVar14] = iVar2;
                lVar14 = lVar14 + 1;
                bVar17 = (bool)(bVar16 | iVar2 == node1);
              } while (lVar14 != 3);
              if ((!bVar16 && iVar2 != node1) &&
                 (uVar10 = ref_cavity_insert_face(local_70,local_4c), uVar10 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x62e,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tet face");
                return uVar10;
              }
              lVar15 = lVar15 + 1;
              lVar19 = lVar19 + 0x10;
            } while (lVar15 < pRVar11->face_per);
          }
        }
LAB_00135baf:
        pRVar3 = pRVar11->ref_adj->item;
        uVar18 = (ulong)pRVar3[(REF_INT)local_60].next;
        if (uVar18 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar3[uVar18].ref;
        }
      }
      pRVar11 = ref_grid->cell[3];
      uVar18 = 0xffffffff;
      if (-1 < node0) {
        uVar18 = 0xffffffff;
        if (node0 < pRVar11->ref_adj->nnode) {
          uVar18 = (ulong)(uint)pRVar11->ref_adj->first[local_40];
        }
      }
      if ((int)uVar18 != -1) {
        RVar12 = pRVar11->ref_adj->item[(int)uVar18].ref;
        do {
          ref_cavity = local_70;
          uVar10 = ref_list_contains(local_70->tri_list,RVar12,&local_80);
          if (uVar10 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x637,"ref_cavity_form_edge_collapse",(ulong)uVar10,"have tet?");
            return uVar10;
          }
          if (local_80 == 0) {
            uVar10 = ref_list_push(ref_cavity->tri_list,RVar12);
            if (uVar10 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x639,"ref_cavity_form_edge_collapse",(ulong)uVar10,"save tri");
              return uVar10;
            }
            lVar15 = (long)RVar12;
            if (0 < (long)pRVar11->node_per) {
              lVar19 = 0;
              bVar17 = false;
              bVar16 = false;
              do {
                bVar21 = true;
                bVar20 = true;
                if (!bVar16) {
                  bVar20 = pRVar11->c2n[pRVar11->size_per * lVar15 + lVar19] == node0;
                }
                if (!bVar17) {
                  bVar21 = pRVar11->c2n[pRVar11->size_per * lVar15 + lVar19] == node1;
                }
                if (local_68->ref_mpi->id !=
                    local_68->part[pRVar11->c2n[RVar12 * pRVar11->size_per + lVar19]])
                goto LAB_001365ab;
                lVar19 = lVar19 + 1;
                bVar17 = bVar21;
                bVar16 = bVar20;
              } while (pRVar11->node_per != lVar19);
              if ((bool)(bVar20 & bVar21)) goto LAB_00135e5e;
            }
            pRVar4 = pRVar11->c2n;
            lVar19 = pRVar11->size_per * lVar15;
            if ((pRVar4[lVar19] != node0) && (pRVar4[lVar19 + 1] != node0)) {
              local_74 = pRVar4[lVar19 + 3];
              local_7c = pRVar4[lVar19];
              local_78 = pRVar4[lVar19 + 1];
              uVar10 = ref_cavity_insert_seg(ref_cavity,&local_7c);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x64b,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tri 0 side 01");
                return uVar10;
              }
            }
            pRVar4 = pRVar11->c2n;
            lVar19 = pRVar11->size_per * lVar15;
            if ((pRVar4[lVar19 + 1] != node0) && (pRVar4[lVar19 + 2] != node0)) {
              local_74 = pRVar4[lVar19 + 3];
              local_7c = pRVar4[lVar19 + 1];
              local_78 = pRVar4[lVar19 + 2];
              uVar10 = ref_cavity_insert_seg(local_70,&local_7c);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x652,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tri 0 side 12");
                return uVar10;
              }
            }
            pRVar4 = pRVar11->c2n;
            lVar15 = pRVar11->size_per * lVar15;
            if ((pRVar4[lVar15 + 2] != node0) && (pRVar4[lVar15] != node0)) {
              local_74 = pRVar4[lVar15 + 3];
              local_7c = pRVar4[lVar15 + 2];
              local_78 = pRVar4[lVar15];
              uVar10 = ref_cavity_insert_seg(local_70,&local_7c);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x659,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tri 0 side 20");
                return uVar10;
              }
            }
          }
LAB_00135e5e:
          pRVar3 = pRVar11->ref_adj->item;
          iVar1 = pRVar3[(int)uVar18].next;
          uVar18 = (ulong)iVar1;
          if (uVar18 == 0xffffffffffffffff) {
            RVar12 = -1;
          }
          else {
            RVar12 = pRVar3[uVar18].ref;
          }
        } while (iVar1 != -1);
      }
      uVar18 = 0xffffffff;
      if (-1 < node1) {
        uVar18 = 0xffffffff;
        if (node1 < pRVar11->ref_adj->nnode) {
          uVar18 = (ulong)(uint)pRVar11->ref_adj->first[local_58];
        }
      }
      if ((int)uVar18 != -1) {
        RVar12 = pRVar11->ref_adj->item[(int)uVar18].ref;
        do {
          ref_cavity = local_70;
          uVar10 = ref_list_contains(local_70->tri_list,RVar12,&local_80);
          if (uVar10 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x660,"ref_cavity_form_edge_collapse",(ulong)uVar10,"have tet?");
            return uVar10;
          }
          if (local_80 == 0) {
            uVar10 = ref_list_push(ref_cavity->tri_list,RVar12);
            if (uVar10 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x662,"ref_cavity_form_edge_collapse",(ulong)uVar10,"save tri");
              return uVar10;
            }
            lVar15 = (long)RVar12;
            if (0 < (long)pRVar11->node_per) {
              lVar19 = 0;
              bVar17 = false;
              bVar16 = false;
              do {
                bVar21 = true;
                bVar20 = true;
                if (!bVar16) {
                  bVar20 = pRVar11->c2n[pRVar11->size_per * lVar15 + lVar19] == node0;
                }
                if (!bVar17) {
                  bVar21 = pRVar11->c2n[pRVar11->size_per * lVar15 + lVar19] == node1;
                }
                if (local_68->ref_mpi->id !=
                    local_68->part[pRVar11->c2n[RVar12 * pRVar11->size_per + lVar19]])
                goto LAB_001365ab;
                lVar19 = lVar19 + 1;
                bVar17 = bVar21;
                bVar16 = bVar20;
              } while (pRVar11->node_per != lVar19);
              if ((bool)(bVar20 & bVar21)) goto LAB_001361d9;
            }
            pRVar4 = pRVar11->c2n;
            lVar19 = pRVar11->size_per * lVar15;
            if ((pRVar4[lVar19] != node1) && (pRVar4[lVar19 + 1] != node1)) {
              local_74 = pRVar4[lVar19 + 3];
              local_7c = pRVar4[lVar19];
              local_78 = pRVar4[lVar19 + 1];
              uVar10 = ref_cavity_insert_seg(ref_cavity,&local_7c);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x674,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tri 1 side 01");
                return uVar10;
              }
            }
            pRVar4 = pRVar11->c2n;
            lVar19 = pRVar11->size_per * lVar15;
            if ((pRVar4[lVar19 + 1] != node1) && (pRVar4[lVar19 + 2] != node1)) {
              local_74 = pRVar4[lVar19 + 3];
              local_7c = pRVar4[lVar19 + 1];
              local_78 = pRVar4[lVar19 + 2];
              uVar10 = ref_cavity_insert_seg(local_70,&local_7c);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x67b,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tri 1 side 12");
                return uVar10;
              }
            }
            pRVar4 = pRVar11->c2n;
            lVar15 = pRVar11->size_per * lVar15;
            if ((pRVar4[lVar15 + 2] != node1) && (pRVar4[lVar15] != node1)) {
              local_74 = pRVar4[lVar15 + 3];
              local_7c = pRVar4[lVar15 + 2];
              local_78 = pRVar4[lVar15];
              uVar10 = ref_cavity_insert_seg(local_70,&local_7c);
              if (uVar10 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x682,"ref_cavity_form_edge_collapse",(ulong)uVar10,"tri 1 side 20");
                return uVar10;
              }
            }
          }
LAB_001361d9:
          pRVar3 = pRVar11->ref_adj->item;
          iVar1 = pRVar3[(int)uVar18].next;
          uVar18 = (ulong)iVar1;
          if (uVar18 == 0xffffffffffffffff) {
            RVar12 = -1;
          }
          else {
            RVar12 = pRVar3[uVar18].ref;
          }
        } while (iVar1 != -1);
      }
      pRVar7 = local_70;
      RVar9 = ref_cavity_verify_face_manifold(local_70);
      pRVar8 = local_70;
      if (RVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x68b,"ref_cavity_form_edge_collapse",1,"collapse face manifold");
        pRVar6 = local_68->real;
        lVar15 = (long)pRVar7->node;
        printf("at %f %f %f\n",pRVar6[lVar15 * 0xf],pRVar6[lVar15 * 0xf + 1],
               pRVar6[lVar15 * 0xf + 2]);
        return 1;
      }
      RVar9 = ref_cavity_verify_seg_manifold(local_70);
      if (RVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x691,"ref_cavity_form_edge_collapse",1,"collapse seg manifold");
        pRVar6 = local_68->real;
        lVar15 = (long)pRVar8->node;
        printf("at %f %f %f\n",pRVar6[lVar15 * 0xf],pRVar6[lVar15 * 0xf + 1],
               pRVar6[lVar15 * 0xf + 2]);
        return 1;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    }
  }
  else {
LAB_001365ab:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;

  REF_INT cell_face;
  REF_INT node, face_nodes[3], seg_nodes[3];
  REF_BOOL will_be_collapsed, already_have_it;
  REF_BOOL has_node0, has_node1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node0), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->collapse_node0 = node0;
  ref_cavity->collapse_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node0 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node0 = has_node0 || (node0 == face_nodes[node]);
      }
      if (!has_node0)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node1 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node1 = has_node1 || (node1 == face_nodes[node]);
      }
      if (!has_node1)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node0 != ref_cell_c2n(ref_cell, 0, cell) &&
        node0 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 01");
    }
    if (node0 != ref_cell_c2n(ref_cell, 1, cell) &&
        node0 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 12");
    }
    if (node0 != ref_cell_c2n(ref_cell, 2, cell) &&
        node0 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 20");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node1 != ref_cell_c2n(ref_cell, 0, cell) &&
        node1 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 01");
    }
    if (node1 != ref_cell_c2n(ref_cell, 1, cell) &&
        node1 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 12");
    }
    if (node1 != ref_cell_c2n(ref_cell, 2, cell) &&
        node1 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 20");
    }
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "collapse face manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSB(ref_cavity_verify_seg_manifold(ref_cavity), "collapse seg manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });

  return REF_SUCCESS;
}